

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_long,char_const*>
               (ostream *out,char *fmt,unsigned_long *args,char **args_1)

{
  FormatListN<2> local_68;
  char **local_28;
  char **args_local_1;
  unsigned_long *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_28 = args_1;
  args_local_1 = (char **)args;
  args_local = (unsigned_long *)fmt;
  fmt_local = (char *)out;
  makeFormatList<unsigned_long,char_const*>
            (&local_68,(tinyformat *)args,(unsigned_long *)args_1,args_1);
  vformat(out,fmt,&local_68.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}